

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

_Bool is_layer_drawn(dbg_layer_t layer)

{
  ushort uVar1;
  bool local_d;
  dbg_layer_t layer_local;
  bool local_1;
  
  uVar1 = (ppu->DISPCNT).raw & 7;
  if (((ppu->DISPCNT).raw & 7) == 0) {
    local_1 = true;
  }
  else if (uVar1 == 1) {
    local_1 = layer < BG3;
  }
  else if (uVar1 == 2) {
    local_d = layer == BG2 || layer == BG3;
    local_1 = local_d;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_layer_drawn(dbg_layer_t layer) {
    switch (ppu->DISPCNT.mode) {
        case 0:
            return true;
        case 1:
            return layer <= BG2;
        case 2:
            return layer == BG2 || layer == BG3;
        default:
            return false;
    }
}